

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_lws_mirror.c
# Opt level: O3

int callback_lws_mirror(lws *wsi,lws_callback_reasons reason,void *user,void *in,size_t len)

{
  uint32_t *tail;
  long lVar1;
  per_session_data__lws_mirror *ppVar2;
  bool bVar3;
  int iVar4;
  uint32_t uVar5;
  uint uVar6;
  int iVar7;
  uint32_t uVar8;
  lws_vhost *plVar9;
  lws_protocols *plVar10;
  mirror_instance *pmVar11;
  long *plVar12;
  size_t sVar13;
  mirror_instance *pmVar14;
  lws_ring *plVar15;
  per_session_data__lws_mirror *ppVar16;
  per_session_data__lws_mirror **pppVar17;
  undefined1 *puVar18;
  undefined8 *puVar19;
  char *pcVar20;
  void **__s1;
  mirror_instance *pmVar21;
  char name [300];
  void *local_168;
  size_t sStack_160;
  
  plVar9 = lws_get_vhost(wsi);
  plVar10 = lws_get_protocol(wsi);
  pmVar11 = (mirror_instance *)lws_protocol_vh_priv_get(plVar9,plVar10);
  if (10 < (int)reason) {
    if ((int)reason < 0x1b) {
      if (reason != LWS_CALLBACK_SERVER_WRITEABLE) {
        if (reason != LWS_CALLBACK_CONFIRM_EXTENSION_OKAY) {
          return 0;
        }
        return 1;
      }
      uVar5 = lws_ring_get_oldest_tail(*(lws_ring **)(*(long *)((long)user + 8) + 0x10));
      tail = (uint32_t *)((long)user + 0x18);
      uVar8 = *(uint32_t *)((long)user + 0x18);
      bVar3 = false;
      do {
        plVar12 = (long *)lws_ring_get_element
                                    (*(lws_ring **)(*(long *)((long)user + 8) + 0x10),tail);
        if (plVar12 == (long *)0x0) break;
        if (*plVar12 == 0) {
          _lws_log(1,"%s: NULL payload: worst = %d, pss->tail = %d\n","callback_lws_mirror",
                   (ulong)uVar5,(ulong)*(uint *)((long)user + 0x18));
          sVar13 = lws_ring_consume(*(lws_ring **)(*(long *)((long)user + 8) + 0x10),tail,
                                    (void *)0x0,1);
          if (sVar13 == 0) break;
        }
        else {
          uVar6 = lws_write(wsi,(uchar *)(*plVar12 + 0x10),plVar12[1],LWS_WRITE_TEXT);
          if ((int)uVar6 < 0) {
            _lws_log(8,"%s: WRITEABLE: %d\n","callback_lws_mirror",(ulong)uVar6);
            return -1;
          }
          lws_ring_consume(*(lws_ring **)(*(long *)((long)user + 8) + 0x10),tail,(void *)0x0,1);
          bVar3 = true;
        }
        iVar7 = lws_send_pipe_choked(wsi);
      } while (iVar7 == 0);
      sVar13 = lws_ring_get_count_waiting_elements
                         (*(lws_ring **)(*(long *)((long)user + 8) + 0x10),tail);
      if (sVar13 != 0) {
        lws_callback_on_writable(wsi);
      }
      if (!bVar3) {
        return 0;
      }
      if (uVar5 != uVar8) {
        return 0;
      }
      lws_set_timeout(*user,NO_PENDING_TIMEOUT,0);
      pmVar14 = *(mirror_instance **)((long)user + 8);
LAB_0010d3ca:
      __mirror_update_worst_tail(pmVar14);
      return 0;
    }
    if (reason == LWS_CALLBACK_PROTOCOL_INIT) {
      plVar9 = lws_get_vhost(wsi);
      plVar10 = lws_get_protocol(wsi);
      lws_protocol_vh_priv_zalloc(plVar9,plVar10,8);
      plVar9 = lws_get_vhost(wsi);
      plVar10 = lws_get_protocol(wsi);
      lws_protocol_vh_priv_get(plVar9,plVar10);
      return 0;
    }
    if (reason != LWS_CALLBACK_EVENT_WAIT_CANCELLED) {
      return 0;
    }
    pcVar20 = "LWS_CALLBACK_EVENT_WAIT_CANCELLED\n";
    iVar7 = 8;
LAB_0010cfae:
    _lws_log(iVar7,pcVar20);
    return 0;
  }
  if (reason == LWS_CALLBACK_ESTABLISHED) {
    _lws_log(8,"%s: LWS_CALLBACK_ESTABLISHED\n","callback_lws_mirror");
    local_168 = (void *)((ulong)local_168 & 0xffffffffffffff00);
    pcVar20 = lws_get_urlarg_by_name(wsi,"mirror",(char *)&local_168,299);
    if (pcVar20 == (char *)0x0) {
      _lws_log(0x10,"get urlarg failed\n");
    }
    pcVar20 = strchr((char *)&local_168,0x3d);
    __s1 = (void **)(pcVar20 + 1);
    if (pcVar20 == (char *)0x0) {
      __s1 = &local_168;
    }
    iVar7 = 3;
    pmVar14 = pmVar11;
    do {
      pmVar14 = pmVar14->next;
      if (pmVar14 == (mirror_instance *)0x0) {
        if (iVar7 == 0) {
          return -1;
        }
        pmVar14 = (mirror_instance *)calloc(1,0x40);
        if (pmVar14 == (mirror_instance *)0x0) {
          return 1;
        }
        plVar15 = lws_ring_create(0x10,0x20,__mirror_destroy_message);
        pmVar14->ring = plVar15;
        if (plVar15 == (lws_ring *)0x0) {
          free(pmVar14);
          return 1;
        }
        pmVar14->next = pmVar11->next;
        pmVar11->next = pmVar14;
        lws_snprintf(pmVar14->name,0x1d,"%s",__s1);
        pmVar14->rx_enabled = '\x01';
        _lws_log(4,"Created new mi %p \'%s\'\n",pmVar14,__s1);
        break;
      }
      iVar4 = strcmp((char *)__s1,pmVar14->name);
      iVar7 = iVar7 + -1;
    } while (iVar4 != 0);
    *(per_session_data__lws_mirror **)((long)user + 0x10) = pmVar14->same_mi_pss_list;
    pmVar14->same_mi_pss_list = (per_session_data__lws_mirror *)user;
    *(mirror_instance **)((long)user + 8) = pmVar14;
    uVar8 = lws_ring_get_oldest_tail(pmVar14->ring);
    *(uint32_t *)((long)user + 0x18) = uVar8;
    *(lws **)user = wsi;
    return 0;
  }
  if (reason == LWS_CALLBACK_CLOSED) {
    pmVar14 = *(mirror_instance **)((long)user + 8);
    if (pmVar14 == (mirror_instance *)0x0) {
      return 0;
    }
    ppVar2 = pmVar14->same_mi_pss_list;
    if (ppVar2 == (per_session_data__lws_mirror *)0x0) {
      *(undefined8 *)((long)user + 8) = 0;
    }
    else {
      pppVar17 = &pmVar14->same_mi_pss_list;
      if (ppVar2 != (per_session_data__lws_mirror *)user) {
        do {
          ppVar16 = ppVar2;
          ppVar2 = ppVar16->same_mi_pss_list;
          if (ppVar2 == (per_session_data__lws_mirror *)0x0) {
            *(undefined8 *)((long)user + 8) = 0;
            goto LAB_0010d3ca;
          }
        } while (ppVar2 != (per_session_data__lws_mirror *)user);
        pppVar17 = &ppVar16->same_mi_pss_list;
      }
      *pppVar17 = *(per_session_data__lws_mirror **)((long)user + 0x10);
      ppVar2 = pmVar14->same_mi_pss_list;
      *(undefined8 *)((long)user + 8) = 0;
      if (ppVar2 != (per_session_data__lws_mirror *)0x0) goto LAB_0010d3ca;
    }
    do {
      pmVar21 = pmVar11;
      pmVar11 = pmVar21->next;
      if (pmVar11 == (mirror_instance *)0x0) {
        return 0;
      }
    } while (pmVar11 != pmVar14);
    pmVar21->next = pmVar11->next;
    lws_ring_destroy(pmVar14->ring);
    free(pmVar14);
    return 0;
  }
  if (reason != LWS_CALLBACK_RECEIVE) {
    return 0;
  }
  sVar13 = lws_ring_get_count_free_elements(*(lws_ring **)(*(long *)((long)user + 8) + 0x10));
  if ((int)sVar13 == 0) {
    _lws_log(4,"dropping!\n");
    lVar1 = *(long *)((long)user + 8);
    if (*(char *)(lVar1 + 0x3a) == '\0') goto LAB_0010d3ec;
    puVar18 = (undefined1 *)(lVar1 + 0x3a);
    for (puVar19 = *(undefined8 **)(lVar1 + 8); puVar19 != (undefined8 *)0x0;
        puVar19 = (undefined8 *)puVar19[2]) {
      lws_rx_flow_control((lws *)*puVar19,0);
    }
  }
  else {
    local_168 = malloc(len + 0x10);
    sStack_160 = len;
    if (local_168 == (void *)0x0) {
      pcVar20 = "OOM: dropping\n";
      iVar7 = 4;
      local_168 = (void *)0x0;
      goto LAB_0010cfae;
    }
    memcpy((void *)((long)local_168 + 0x10),in,len);
    sVar13 = lws_ring_insert(*(lws_ring **)(*(long *)((long)user + 8) + 0x10),&local_168,1);
    if (sVar13 == 0) {
      free(local_168);
      local_168 = (void *)0x0;
      sStack_160 = 0;
      _lws_log(4,"dropping!\n");
      lVar1 = *(long *)((long)user + 8);
      if (*(char *)(lVar1 + 0x3a) == '\0') goto LAB_0010d3ec;
      puVar18 = (undefined1 *)(lVar1 + 0x3a);
      for (puVar19 = *(undefined8 **)(lVar1 + 8); puVar19 != (undefined8 *)0x0;
          puVar19 = (undefined8 *)puVar19[2]) {
        lws_rx_flow_control((lws *)*puVar19,0);
      }
    }
    else {
      if ((*(char *)(*(long *)((long)user + 8) + 0x3a) == '\0') ||
         (sVar13 = lws_ring_get_count_free_elements
                             (*(lws_ring **)(*(long *)((long)user + 8) + 0x10)), 3 < sVar13))
      goto LAB_0010d3ec;
      lVar1 = *(long *)((long)user + 8);
      for (puVar19 = *(undefined8 **)(lVar1 + 8); puVar19 != (undefined8 *)0x0;
          puVar19 = (undefined8 *)puVar19[2]) {
        lws_rx_flow_control((lws *)*puVar19,0);
      }
      puVar18 = (undefined1 *)(lVar1 + 0x3a);
    }
  }
  *puVar18 = 0;
LAB_0010d3ec:
  for (puVar19 = *(undefined8 **)(*(long *)((long)user + 8) + 8); puVar19 != (undefined8 *)0x0;
      puVar19 = (undefined8 *)puVar19[2]) {
    lws_callback_on_writable((lws *)*puVar19);
  }
  return 0;
}

Assistant:

static int
callback_lws_mirror(struct lws *wsi, enum lws_callback_reasons reason,
		    void *user, void *in, size_t len)
{
	struct per_session_data__lws_mirror *pss =
			(struct per_session_data__lws_mirror *)user;
	struct per_vhost_data__lws_mirror *v =
			(struct per_vhost_data__lws_mirror *)
			lws_protocol_vh_priv_get(lws_get_vhost(wsi),
						 lws_get_protocol(wsi));
	char name[300], update_worst, sent_something, *pn = name;
	struct mirror_instance *mi = NULL;
	const struct a_message *msg;
	struct a_message amsg;
	uint32_t oldest_tail;
	int n, count_mi = 0;

	switch (reason) {
	case LWS_CALLBACK_ESTABLISHED:
		lwsl_info("%s: LWS_CALLBACK_ESTABLISHED\n", __func__);

		/*
		 * mirror instance name... defaults to "", but if URL includes
		 * "?mirror=xxx", will be "xxx"
		 */
		name[0] = '\0';
		if (!lws_get_urlarg_by_name(wsi, "mirror", name,
					   sizeof(name) - 1))
			lwsl_debug("get urlarg failed\n");
		if (strchr(name, '='))
			pn = strchr(name, '=') + 1;

		//lwsl_notice("%s: mirror name '%s'\n", __func__, pn);

		/* is there already a mirror instance of this name? */

		lws_pthread_mutex_lock(&v->lock); /* vhost lock { */

		lws_start_foreach_ll(struct mirror_instance *, mi1,
				     v->mi_list) {
			count_mi++;
			if (!strcmp(pn, mi1->name)) {
				/* yes... we will join it */
				mi = mi1;
				break;
			}
		} lws_end_foreach_ll(mi1, next);

		if (!mi) {

			/* no existing mirror instance for name */
			if (count_mi == MAX_MIRROR_INSTANCES) {
				lws_pthread_mutex_unlock(&v->lock); /* } vh lock */
				return -1;
			}

			/* create one with this name, and join it */
			mi = malloc(sizeof(*mi));
			if (!mi)
				goto bail1;
			memset(mi, 0, sizeof(*mi));
			mi->ring = lws_ring_create(sizeof(struct a_message),
						   QUEUELEN,
						   __mirror_destroy_message);
			if (!mi->ring) {
				free(mi);
				goto bail1;
			}

			mi->next = v->mi_list;
			v->mi_list = mi;
			lws_snprintf(mi->name, sizeof(mi->name) - 1, "%s", pn);
			mi->rx_enabled = 1;

			lws_pthread_mutex_init(&mi->lock);

			lwsl_notice("Created new mi %p '%s'\n", mi, pn);
		}

		/* add our pss to list of guys bound to this mi */

		lws_ll_fwd_insert(pss, same_mi_pss_list, mi->same_mi_pss_list);

		/* init the pss */

		pss->mi = mi;
		pss->tail = lws_ring_get_oldest_tail(mi->ring);
		pss->wsi = wsi;

		lws_pthread_mutex_unlock(&v->lock); /* } vhost lock */
		break;

bail1:
		lws_pthread_mutex_unlock(&v->lock); /* } vhost lock */
		return 1;

	case LWS_CALLBACK_CLOSED:
		/* detach our pss from the mirror instance */
		mi = pss->mi;
		if (!mi)
			break;

		lws_pthread_mutex_lock(&v->lock); /* vhost lock { */

		/* remove our closing pss from its mirror instance list */
		lws_ll_fwd_remove(struct per_session_data__lws_mirror,
				  same_mi_pss_list, pss, mi->same_mi_pss_list);
		pss->mi = NULL;

		if (mi->same_mi_pss_list) {
			/*
			 * Still other pss using the mirror instance.  The pss
			 * going away may have had the oldest tail, reconfirm
			 * using the remaining pss what is the current oldest
			 * tail.  If the oldest tail moves on, this call also
			 * will re-enable rx flow control when appropriate.
			 */
			lws_pthread_mutex_lock(&mi->lock); /* mi lock { */
			__mirror_update_worst_tail(mi);
			lws_pthread_mutex_unlock(&mi->lock); /* } mi lock */
			lws_pthread_mutex_unlock(&v->lock); /* } vhost lock */
			break;
		}

		/* No more pss using the mirror instance... delete mi */

		lws_start_foreach_llp(struct mirror_instance **,
				pmi, v->mi_list) {
			if (*pmi == mi) {
				*pmi = (*pmi)->next;

				lws_ring_destroy(mi->ring);
				lws_pthread_mutex_destroy(&mi->lock);

				free(mi);
				break;
			}
		} lws_end_foreach_llp(pmi, next);

		lws_pthread_mutex_unlock(&v->lock); /* } vhost lock */
		break;

	case LWS_CALLBACK_CONFIRM_EXTENSION_OKAY:
		return 1; /* disallow compression */

	case LWS_CALLBACK_PROTOCOL_INIT: /* per vhost */
		lws_protocol_vh_priv_zalloc(lws_get_vhost(wsi),
				lws_get_protocol(wsi),
				sizeof(struct per_vhost_data__lws_mirror));
		v = (struct per_vhost_data__lws_mirror *)
				lws_protocol_vh_priv_get(lws_get_vhost(wsi),
							 lws_get_protocol(wsi));
		lws_pthread_mutex_init(&v->lock);
		break;

	case LWS_CALLBACK_PROTOCOL_DESTROY:
		lws_pthread_mutex_destroy(&v->lock);
		break;

	case LWS_CALLBACK_SERVER_WRITEABLE:
		lws_pthread_mutex_lock(&pss->mi->lock); /* instance lock { */
		oldest_tail = lws_ring_get_oldest_tail(pss->mi->ring);
		update_worst = oldest_tail == pss->tail;
		sent_something = 0;

		do {
			msg = lws_ring_get_element(pss->mi->ring, &pss->tail);
			if (!msg)
				break;

			if (!msg->payload) {
				lwsl_err("%s: NULL payload: worst = %d,"
					 " pss->tail = %d\n", __func__,
					 oldest_tail, pss->tail);
				if (lws_ring_consume(pss->mi->ring, &pss->tail,
						     NULL, 1))
					continue;
				break;
			}

			n = lws_write(wsi, (unsigned char *)msg->payload +
				      LWS_PRE, msg->len, LWS_WRITE_TEXT);
			if (n < 0) {
				lwsl_info("%s: WRITEABLE: %d\n", __func__, n);

				goto bail2;
			}
			sent_something = 1;
			lws_ring_consume(pss->mi->ring, &pss->tail, NULL, 1);

		} while (!lws_send_pipe_choked(wsi));

		/* if any left for us to send, ask for writeable again */
		if (lws_ring_get_count_waiting_elements(pss->mi->ring,
							&pss->tail))
			lws_callback_on_writable(wsi);

		if (!sent_something || !update_worst)
			goto done1;

		/*
		 * We are no longer holding the oldest tail (since we sent
		 * something.  So free us of the timeout related to hogging the
		 * oldest tail.
		 */
		lws_set_timeout(pss->wsi, NO_PENDING_TIMEOUT, 0);
		/*
		 * If we were originally at the oldest fifo position of
		 * all the tails, now we used some up we may have
		 * changed the oldest fifo position and made some space.
		 */
		__mirror_update_worst_tail(pss->mi);

done1:
		lws_pthread_mutex_unlock(&pss->mi->lock); /* } instance lock */
		break;

bail2:
		lws_pthread_mutex_unlock(&pss->mi->lock); /* } instance lock */

		return -1;

	case LWS_CALLBACK_RECEIVE:
		lws_pthread_mutex_lock(&pss->mi->lock); /* mi lock { */
		n = (int)lws_ring_get_count_free_elements(pss->mi->ring);
		if (!n) {
			lwsl_notice("dropping!\n");
			if (pss->mi->rx_enabled)
				__mirror_rxflow_instance(pss->mi, 0);
			goto req_writable;
		}

		amsg.payload = malloc(LWS_PRE + len);
		amsg.len = len;
		if (!amsg.payload) {
			lwsl_notice("OOM: dropping\n");
			goto done2;
		}

		memcpy((char *)amsg.payload + LWS_PRE, in, len);
		if (!lws_ring_insert(pss->mi->ring, &amsg, 1)) {
			__mirror_destroy_message(&amsg);
			lwsl_notice("dropping!\n");
			if (pss->mi->rx_enabled)
				__mirror_rxflow_instance(pss->mi, 0);
			goto req_writable;
		}

		if (pss->mi->rx_enabled &&
		    lws_ring_get_count_free_elements(pss->mi->ring) <
								    RXFLOW_MIN)
			__mirror_rxflow_instance(pss->mi, 0);

req_writable:
		__mirror_callback_all_in_mi_on_writable(pss->mi);

done2:
		lws_pthread_mutex_unlock(&pss->mi->lock); /* } mi lock */
		break;

	case LWS_CALLBACK_EVENT_WAIT_CANCELLED:
		lwsl_info("LWS_CALLBACK_EVENT_WAIT_CANCELLED\n");
		break;

	default:
		break;
	}

	return 0;
}